

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

wstring * pugi::impl::(anonymous_namespace)::as_wide_impl_abi_cxx11_(char *str,size_t size)

{
  value_type vVar1;
  undefined8 uVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  wstring *in_RDI;
  value_type end;
  value_type begin;
  size_t length;
  uint8_t *data;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result;
  
  vVar1 = anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_counter>
                    (in_RSI,in_RDX,0);
  std::__cxx11::wstring::wstring(in_RDI);
  std::__cxx11::wstring::resize((ulong)in_RDI);
  if (vVar1 != 0) {
    uVar2 = std::__cxx11::wstring::operator[]((ulong)in_RDI);
    anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
              (in_RSI,in_RDX,uVar2);
  }
  return in_RDI;
}

Assistant:

PUGI_IMPL_FN std::basic_string<wchar_t> as_wide_impl(const char* str, size_t size)
	{
		const uint8_t* data = reinterpret_cast<const uint8_t*>(str);

		// first pass: get length in wchar_t units
		size_t length = utf8_decoder::process(data, size, 0, wchar_counter());

		// allocate resulting string
		std::basic_string<wchar_t> result;
		result.resize(length);

		// second pass: convert to wchar_t
		if (length > 0)
		{
			wchar_writer::value_type begin = reinterpret_cast<wchar_writer::value_type>(&result[0]);
			wchar_writer::value_type end = utf8_decoder::process(data, size, begin, wchar_writer());

			assert(begin + length == end);
			(void)!end;
		}

		return result;
	}